

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::SetCursorPos(ImVec2 *local_pos)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImVec2 IVar3;
  
  pIVar2 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar1 = pIVar2->CurrentWindow;
  IVar3.x = (*local_pos).x + ((pIVar1->Pos).x - (pIVar1->Scroll).x);
  IVar3.y = (*local_pos).y + ((pIVar1->Pos).y - (pIVar1->Scroll).y);
  (pIVar1->DC).CursorPos = IVar3;
  (pIVar1->DC).IsSetPos = true;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }